

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# palobjbase.cpp
# Opt level: O0

DWORD __thiscall CorUnix::CPalObjectBase::ReleaseReference(CPalObjectBase *this,CPalThread *pthr)

{
  DWORD DVar1;
  int iVar2;
  OBJECTCLEANUPROUTINE p_Var3;
  bool fCleanupSharedState;
  LONG lRefCount;
  CPalThread *pthr_local;
  CPalObjectBase *this_local;
  
  if (pthr == (CPalThread *)0x0) {
    fprintf(_stderr,"] %s %s:%d","ReleaseReference",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/palobjbase.cpp"
            ,0x10e);
    fprintf(_stderr,"Expression: NULL != pthr\n");
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  (*(this->super_IPalObject)._vptr_IPalObject[0xd])(this,pthr);
  if (this->m_lRefCount < 1) {
    fprintf(_stderr,"] %s %s:%d","ReleaseReference",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/palobjbase.cpp"
            ,0x118);
    fprintf(_stderr,"Expression: m_lRefCount > 0\n");
  }
  DVar1 = InterlockedDecrement(&this->m_lRefCount);
  if (DVar1 == 0) {
    iVar2 = (*(this->super_IPalObject)._vptr_IPalObject[0xe])(this,pthr,1);
    this->m_pthrCleanup = pthr;
    CPalThread::AddThreadReference(pthr);
    p_Var3 = CObjectType::GetObjectCleanupRoutine(this->m_pot);
    if (p_Var3 != (OBJECTCLEANUPROUTINE)0x0) {
      p_Var3 = CObjectType::GetObjectCleanupRoutine(this->m_pot);
      (*p_Var3)(pthr,&this->super_IPalObject,false,(bool)((byte)iVar2 & 1));
    }
    InternalDelete<CorUnix::CPalObjectBase>(this);
    CPalThread::ReleaseThreadReference(pthr);
  }
  else {
    (*(this->super_IPalObject)._vptr_IPalObject[0xe])(this,pthr,0);
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  return DVar1;
}

Assistant:

DWORD
CPalObjectBase::ReleaseReference(
    CPalThread *pthr
    )
{
    LONG lRefCount;

    _ASSERTE(NULL != pthr);

    ENTRY("CPalObjectBase::ReleaseReference"
        "(this = %p, pthr = %p)\n",
        this,
        pthr
        );

    AcquireObjectDestructionLock(pthr);

    _ASSERTE(m_lRefCount > 0); 

    //
    // Even though object destruction takes place under a lock
    // we still need to use an interlocked decrement, as AddRef
    // operates lock free
    //

    lRefCount = InterlockedDecrement(&m_lRefCount);

    if (0 == lRefCount)
    {
        bool fCleanupSharedState = ReleaseObjectDestructionLock(pthr, TRUE);

        //
        // We need to do two things with the calling thread data here:
        // 1) store it in m_pthrCleanup so it is available to the destructors
        // 2) Add a reference to it before starting any cleanup, and release
        //    that reference afterwords.
        //
        // Step 2 is necessary when we're cleaning up the thread object that
        // represents the calling thread -- it ensures that the thread data
        // is available throughout the entire cleanup process.
        //

        m_pthrCleanup = pthr;
        pthr->AddThreadReference();

        if (NULL != m_pot->GetObjectCleanupRoutine())
        {
            (*m_pot->GetObjectCleanupRoutine())(
                pthr,
                static_cast<IPalObject*>(this),
                FALSE,
                fCleanupSharedState
                );
        }

        InternalDelete(this);

        pthr->ReleaseThreadReference();
    }
    else
    {       
        ReleaseObjectDestructionLock(pthr, FALSE);
    }

    LOGEXIT("CPalObjectBase::ReleaseReference returns %d\n", lRefCount);

    return lRefCount;
}